

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::reset_midi(Renderer *this)

{
  int i;
  long lVar1;
  Channel *pCVar2;
  
  pCVar2 = this->channel;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    reset_controllers(this,(int)lVar1);
    pCVar2->program = this->default_program;
    pCVar2->panning = -1;
    pCVar2->pitchsens = 200;
    pCVar2->bank = 0;
    pCVar2 = pCVar2 + 1;
  }
  memset(this->voice,0,(long)this->voices * 0x170);
  return;
}

Assistant:

void Renderer::reset_midi()
{
	for (int i = 0; i < MAXCHAN; i++)
	{
		reset_controllers(i);
		/* The rest of these are unaffected by the Reset All Controllers event */
		channel[i].program = default_program;
		channel[i].panning = NO_PANNING;
		channel[i].pitchsens = 200;
		channel[i].bank = 0; /* tone bank or drum set */
	}
	reset_voices();
}